

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int sign_certificate(ptls_sign_certificate_t *_self,ptls_t *tls,uint16_t *selected_algorithm,
                    ptls_buffer_t *outbuf,ptls_iovec_t input,uint16_t *algorithms,
                    size_t num_algorithms)

{
  uint16_t *puVar1;
  uint16_t uVar2;
  EVP_PKEY *pkey;
  ptls_sign_certificate_t *ppVar3;
  int iVar4;
  int iVar5;
  EVP_MD_CTX *ctx;
  EVP_MD *pEVar6;
  ptls_sign_certificate_t *ppVar7;
  size_t sVar8;
  size_t local_40;
  EVP_PKEY_CTX *pkey_ctx;
  
  ppVar3 = _self;
  do {
    ppVar7 = ppVar3;
    uVar2 = *(uint16_t *)&ppVar7[2].cb;
    if (uVar2 == 0xffff) {
      return 0x28;
    }
    sVar8 = 0;
    while (ppVar3 = ppVar7 + 2, num_algorithms != sVar8) {
      puVar1 = algorithms + sVar8;
      sVar8 = sVar8 + 1;
      if (*puVar1 == uVar2) {
        *selected_algorithm = uVar2;
        pkey = (EVP_PKEY *)_self[1].cb;
        pEVar6 = (EVP_MD *)ppVar7[3].cb;
        ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
        if (ctx == (EVP_MD_CTX *)0x0) {
          return 0x201;
        }
        iVar4 = EVP_DigestSignInit(ctx,(EVP_PKEY_CTX **)&pkey_ctx,pEVar6,(ENGINE *)0x0,pkey);
        iVar5 = 0x203;
        if (iVar4 != 1) goto LAB_0010643c;
        iVar4 = EVP_PKEY_get_id(pkey);
        if (iVar4 == 6) {
          iVar4 = EVP_PKEY_CTX_set_rsa_padding(pkey_ctx,6);
          if ((iVar4 != 1) ||
             (iVar4 = EVP_PKEY_CTX_set_rsa_pss_saltlen(pkey_ctx,0xffffffffffffffff), iVar4 != 1))
          goto LAB_0010643c;
          pEVar6 = EVP_sha256();
          iVar4 = EVP_PKEY_CTX_set_rsa_mgf1_md(pkey_ctx,pEVar6);
          if (iVar4 != 1) goto LAB_0010643c;
        }
        iVar4 = EVP_DigestSignUpdate(ctx,input.base,input.len);
        if ((iVar4 == 1) && (iVar4 = EVP_DigestSignFinal(ctx,(uchar *)0x0,&local_40), iVar4 == 1)) {
          msg("reserving %ld bytes",local_40);
          iVar5 = ptls_buffer_reserve(outbuf,local_40);
          if (iVar5 == 0) {
            iVar4 = EVP_DigestSignFinal(ctx,outbuf->base + outbuf->off,&local_40);
            iVar5 = 0x203;
            if (iVar4 == 1) {
              outbuf->off = outbuf->off + local_40;
              iVar5 = 0;
            }
          }
        }
LAB_0010643c:
        EVP_MD_CTX_free(ctx);
        return iVar5;
      }
    }
  } while( true );
}

Assistant:

static int sign_certificate(ptls_sign_certificate_t *_self, ptls_t *tls, uint16_t *selected_algorithm, ptls_buffer_t *outbuf,
                            ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_openssl_sign_certificate_t *self = (ptls_openssl_sign_certificate_t *)_self;
    const struct st_ptls_openssl_signature_scheme_t *scheme;

    /* select the algorithm */
    for (scheme = self->schemes; scheme->scheme_id != UINT16_MAX; ++scheme) {
        size_t i;
        for (i = 0; i != num_algorithms; ++i)
            if (algorithms[i] == scheme->scheme_id)
                goto Found;
    }
    return PTLS_ALERT_HANDSHAKE_FAILURE;

Found:
    *selected_algorithm = scheme->scheme_id;
    return do_sign(self->key, outbuf, input, scheme->scheme_md);
}